

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void aom_highbd_blend_a64_d16_mask_avx2
               (uint8_t *dst8,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,
               int h,int subw,int subh,ConvolveParams *conv_params,int bd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  char cVar5;
  byte bVar6;
  ushort uVar7;
  int iVar8;
  uint dst_stride_00;
  int iVar9;
  uint32_t src0_stride_00;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 in_stack_0000003c;
  __m256i mask_max;
  __m256i clip_high;
  __m256i clip_low;
  int shift;
  __m256i v_round_offset;
  int32_t round_offset;
  int round_bits;
  uint16_t *dst;
  undefined4 in_stack_fffffffffffffd0c;
  undefined8 in_stack_fffffffffffffd20;
  undefined4 uVar12;
  undefined8 in_stack_fffffffffffffd28;
  undefined4 uVar13;
  __m256i *in_stack_fffffffffffffd40;
  __m256i *in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  undefined8 in_stack_fffffffffffffd78;
  CONV_BUF_TYPE *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  undefined3 in_stack_fffffffffffffd8c;
  undefined1 local_1e0 [4];
  uint32_t in_stack_fffffffffffffe44;
  uint16_t *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe98;
  uint16_t *local_e0;
  CONV_BUF_TYPE *pCStack_d0;
  CONV_BUF_TYPE *local_a0;
  uint8_t *puStack_98;
  CONV_BUF_TYPE *pCStack_90;
  uint8_t *puStack_88;
  
  iVar9 = -(*(int *)(CONCAT44(in_stack_0000003c,subh) + 0x14) +
           *(int *)(CONCAT44(in_stack_0000003c,subh) + 0x18));
  iVar8 = iVar9 + 0xe;
  cVar5 = (char)iVar8;
  bVar6 = cVar5 + (byte)conv_params;
  src0_stride_00 = (1 << (bVar6 & 0x1f)) + (1 << (bVar6 - 1 & 0x1f));
  dst_stride_00 = (src0_stride_00 - (1 << (cVar5 - 1U & 0x1f))) * 0x40;
  auVar1 = vpinsrd_avx(ZEXT416(dst_stride_00),dst_stride_00,1);
  auVar1 = vpinsrd_avx(auVar1,dst_stride_00,2);
  auVar1 = vpinsrd_avx(auVar1,dst_stride_00,3);
  auVar2 = vpinsrd_avx(ZEXT416(dst_stride_00),dst_stride_00,1);
  auVar2 = vpinsrd_avx(auVar2,dst_stride_00,2);
  auVar2 = vpinsrd_avx(auVar2,dst_stride_00,3);
  _local_1e0 = auVar1._0_8_;
  iVar9 = iVar9 + 0x14;
  uVar7 = (short)(1 << ((byte)conv_params & 0x1f)) - 1;
  auVar3 = vpinsrw_avx(ZEXT216(uVar7),(uint)uVar7,1);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar7,2);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar7,3);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar7,4);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar7,5);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar7,6);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar7,7);
  auVar4 = vpinsrw_avx(ZEXT216(uVar7),(uint)uVar7,1);
  auVar4 = vpinsrw_avx(auVar4,(uint)uVar7,2);
  auVar4 = vpinsrw_avx(auVar4,(uint)uVar7,3);
  auVar4 = vpinsrw_avx(auVar4,(uint)uVar7,4);
  auVar4 = vpinsrw_avx(auVar4,(uint)uVar7,5);
  auVar4 = vpinsrw_avx(auVar4,(uint)uVar7,6);
  auVar4 = vpinsrw_avx(auVar4,(uint)uVar7,7);
  local_e0 = auVar3._0_8_;
  pCStack_d0 = auVar4._0_8_;
  auVar11 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar11 = vpinsrw_avx(auVar11,0x40,2);
  auVar11 = vpinsrw_avx(auVar11,0x40,3);
  auVar11 = vpinsrw_avx(auVar11,0x40,4);
  auVar11 = vpinsrw_avx(auVar11,0x40,5);
  auVar11 = vpinsrw_avx(auVar11,0x40,6);
  auVar11 = vpinsrw_avx(auVar11,0x40,7);
  auVar10 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar10 = vpinsrw_avx(auVar10,0x40,2);
  auVar10 = vpinsrw_avx(auVar10,0x40,3);
  auVar10 = vpinsrw_avx(auVar10,0x40,4);
  auVar10 = vpinsrw_avx(auVar10,0x40,5);
  auVar10 = vpinsrw_avx(auVar10,0x40,6);
  auVar10 = vpinsrw_avx(auVar10,0x40,7);
  auVar10 = ZEXT116(0) * auVar11 + ZEXT116(1) * auVar10;
  auVar11 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar11;
  local_a0 = auVar10._0_8_;
  puStack_98 = auVar10._8_8_;
  pCStack_90 = auVar11._0_8_;
  puStack_88 = auVar11._8_8_;
  uVar13 = (undefined4)((ulong)in_stack_fffffffffffffd28 >> 0x20);
  uVar12 = (undefined4)((ulong)in_stack_fffffffffffffd20 >> 0x20);
  if ((h == 0) && (subw == 0)) {
    if (mask_stride == 4) {
      highbd_blend_a64_d16_mask_subw0_subh0_w4_avx2
                ((uint16_t *)CONCAT44(src0_stride_00,iVar8),
                 CONCAT13(bVar6,in_stack_fffffffffffffd8c),in_stack_fffffffffffffd80,
                 (uint32_t)((ulong)in_stack_fffffffffffffd78 >> 0x20),
                 (CONV_BUF_TYPE *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                 (uint32_t)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffd0c,mask._0_4_),w,(int)local_1e0,
                 (__m256i *)CONCAT44(uVar12,iVar9),(int)&stack0xfffffffffffffde0,
                 (__m256i *)&stack0xfffffffffffffdc0,(__m256i *)&stack0xfffffffffffffda0,
                 in_stack_fffffffffffffd40);
    }
    else if (mask_stride == 8) {
      highbd_blend_a64_d16_mask_subw0_subh0_w8_avx2
                (local_e0,auVar11._12_4_,pCStack_90,auVar10._12_4_,local_a0,CONCAT22(0x40,uVar7),
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffd0c,mask._0_4_),w,(int)local_1e0,
                 (__m256i *)CONCAT44(uVar12,iVar9),(int)&stack0xfffffffffffffde0,
                 (__m256i *)&stack0xfffffffffffffdc0,(__m256i *)&stack0xfffffffffffffda0,
                 in_stack_fffffffffffffd40);
    }
    else {
      highbd_blend_a64_d16_mask_subw0_subh0_w16_avx2
                ((uint16_t *)0x0,auVar4._12_4_,pCStack_d0,auVar3._12_4_,local_e0,auVar11._12_4_,
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffd0c,mask._0_4_),w,mask_stride,
                 (int)local_1e0,(__m256i *)CONCAT44(uVar13,iVar9),(int)&stack0xfffffffffffffde0,
                 (__m256i *)&stack0xfffffffffffffdc0,(__m256i *)&stack0xfffffffffffffda0,
                 in_stack_fffffffffffffd48);
    }
  }
  else if ((h == 1) && (subw == 1)) {
    if (mask_stride == 4) {
      highbd_blend_a64_d16_mask_subw1_subh1_w4_avx2
                (in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,auVar2._8_8_,auVar2._4_4_,
                 auVar1._8_8_,auVar1._4_4_,(uint8_t *)CONCAT44(in_stack_fffffffffffffd0c,mask._0_4_)
                 ,w,(int)local_1e0,(__m256i *)CONCAT44(uVar12,iVar9),(int)&stack0xfffffffffffffde0,
                 (__m256i *)&stack0xfffffffffffffdc0,(__m256i *)&stack0xfffffffffffffda0,
                 in_stack_fffffffffffffd40);
    }
    else if (mask_stride == 8) {
      highbd_blend_a64_d16_mask_subw1_subh1_w8_avx2
                ((uint16_t *)SUB328(ZEXT832(0),4),0,
                 (CONV_BUF_TYPE *)CONCAT44(dst_stride_00,in_stack_fffffffffffffe98),
                 (int)((ulong)in_RDI >> 0x20),
                 (CONV_BUF_TYPE *)CONCAT44(in_ESI,in_stack_fffffffffffffe88),
                 (int)((ulong)in_RDX >> 0x20),
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffd0c,mask._0_4_),w,(int)local_1e0,
                 (__m256i *)CONCAT44(uVar12,iVar9),(int)&stack0xfffffffffffffde0,
                 (__m256i *)&stack0xfffffffffffffdc0,(__m256i *)&stack0xfffffffffffffda0,
                 in_stack_fffffffffffffd40);
    }
    else {
      highbd_blend_a64_d16_mask_subw1_subh1_w16_avx2
                ((uint16_t *)CONCAT44(dst_stride_00,dst_stride_00),dst_stride_00,auVar2._8_8_,
                 auVar2._4_4_,auVar1._8_8_,auVar1._4_4_,
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffd0c,mask._0_4_),w,mask_stride,
                 (int)local_1e0,(__m256i *)CONCAT44(uVar13,iVar9),(int)&stack0xfffffffffffffde0,
                 (__m256i *)&stack0xfffffffffffffdc0,(__m256i *)&stack0xfffffffffffffda0,
                 in_stack_fffffffffffffd48);
    }
  }
  else {
    aom_highbd_blend_a64_d16_mask_c
              (puStack_98,auVar10._4_4_,
               (CONV_BUF_TYPE *)CONCAT26(0x40,CONCAT24(uVar7,dst_stride_00)),src0_stride_00,
               (CONV_BUF_TYPE *)
               CONCAT44(CONCAT13(bVar6,in_stack_fffffffffffffd8c),in_stack_fffffffffffffd88),
               (uint32_t)((ulong)in_stack_fffffffffffffd80 >> 0x20),puStack_88,auVar3._0_4_,
               auVar3._8_4_,auVar4._0_4_,auVar4._8_4_,0,SUB328(ZEXT832(0),4),0);
  }
  return;
}

Assistant:

void aom_highbd_blend_a64_d16_mask_avx2(
    uint8_t *dst8, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h, int subw, int subh,
    ConvolveParams *conv_params, const int bd) {
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst8);
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int32_t round_offset =
      ((1 << (round_bits + bd)) + (1 << (round_bits + bd - 1)) -
       (1 << (round_bits - 1)))
      << AOM_BLEND_A64_ROUND_BITS;
  const __m256i v_round_offset = _mm256_set1_epi32(round_offset);
  const int shift = round_bits + AOM_BLEND_A64_ROUND_BITS;

  const __m256i clip_low = _mm256_setzero_si256();
  const __m256i clip_high = _mm256_set1_epi16((1 << bd) - 1);
  const __m256i mask_max = _mm256_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  assert(IMPLIES((void *)src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES((void *)src1 == dst, src1_stride == dst_stride));

  assert(h >= 4);
  assert(w >= 4);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  if (subw == 0 && subh == 0) {
    switch (w) {
      case 4:
        highbd_blend_a64_d16_mask_subw0_subh0_w4_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
      case 8:
        highbd_blend_a64_d16_mask_subw0_subh0_w8_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
      default:  // >= 16
        highbd_blend_a64_d16_mask_subw0_subh0_w16_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
    }

  } else if (subw == 1 && subh == 1) {
    switch (w) {
      case 4:
        highbd_blend_a64_d16_mask_subw1_subh1_w4_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
      case 8:
        highbd_blend_a64_d16_mask_subw1_subh1_w8_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
      default:  // >= 16
        highbd_blend_a64_d16_mask_subw1_subh1_w16_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
    }
  } else {
    // Sub-sampling in only one axis doesn't seem to happen very much, so fall
    // back to the vanilla C implementation instead of having all the optimised
    // code for these.
    aom_highbd_blend_a64_d16_mask_c(dst8, dst_stride, src0, src0_stride, src1,
                                    src1_stride, mask, mask_stride, w, h, subw,
                                    subh, conv_params, bd);
  }
}